

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlRule::DebugXml(GdlRule *this,GrcManager *pcman,ofstream *strmOut,string *staPathToCur,
                 int nPassNum,int nRuleNum)

{
  undefined8 uVar1;
  int iVar2;
  ostream *poVar3;
  GrpLineAndFile *this_00;
  size_type_conflict sVar4;
  reference ppGVar5;
  reference ppGVar6;
  string *in_RCX;
  ostream *in_RDX;
  undefined8 in_RSI;
  GdlObject *in_RDI;
  int in_R8D;
  int in_R9D;
  size_t irit_3;
  int iritRhs;
  size_t irit_2;
  size_t irit_1;
  GdlSetAttrItem *pritset;
  GdlSubstitutionItem *pritsub;
  GdlRuleItem *prit;
  int irit;
  bool fContext;
  bool fLhs;
  GrpLineAndFile lnf;
  size_t iexp;
  GrpLineAndFile *in_stack_fffffffffffffd68;
  ulong uVar7;
  GrpLineAndFile *in_stack_fffffffffffffd70;
  value_type pGVar8;
  string *in_stack_fffffffffffffdc0;
  GrpLineAndFile *in_stack_fffffffffffffdc8;
  ostream *in_stack_fffffffffffffdd0;
  GrcManager *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  string local_188 [32];
  ulong local_168;
  undefined4 local_15c;
  string local_158 [32];
  ulong local_138;
  string local_130 [32];
  ulong local_110;
  long local_108;
  long local_100;
  value_type local_f8;
  int local_f0;
  byte local_ea;
  byte local_e9;
  string local_e8 [32];
  string local_c8 [32];
  GrpLineAndFile local_a8;
  ulong local_80;
  string local_68 [32];
  string local_48 [32];
  int local_28;
  int local_24;
  ostream *local_18;
  undefined8 local_10;
  
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_18 = in_RDX;
  local_10 = in_RSI;
  poVar3 = std::operator<<(in_RDX,"      <rule id=\"");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_24);
  poVar3 = std::operator<<(poVar3,".");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28);
  poVar3 = std::operator<<(poVar3,"\" inFile=\"");
  GdlObject::LineAndFile(in_RDI);
  std::__cxx11::string::string(local_68,in_RCX);
  GrpLineAndFile::FileWithPath(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  poVar3 = std::operator<<(poVar3,local_48);
  poVar3 = std::operator<<(poVar3,"\" atLine=\"");
  this_00 = GdlObject::LineAndFile(in_RDI);
  iVar2 = GrpLineAndFile::OriginalLine(this_00);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  poVar3 = std::operator<<(poVar3,"\" preAnys=\"");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ulong *)&in_RDI[6].m_lnf.field_0x18);
  std::operator<<(poVar3,"\"\n            prettyPrint=\"");
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  RulePrettyPrint((GdlRule *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                  in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                  SUB81((ulong)in_stack_fffffffffffffdc8 >> 0x38,0));
  std::operator<<(local_18,"\" >\n");
  sVar4 = std::vector<GdlExpression_*,_std::allocator<GdlExpression_*>_>::size
                    ((vector<GdlExpression_*,_std::allocator<GdlExpression_*>_> *)
                     &in_RDI[1].m_lnf.field_0x20);
  if (sVar4 != 0) {
    std::operator<<(local_18,"        <ruleConstraints>\n");
    for (local_80 = 0; uVar7 = local_80,
        sVar4 = std::vector<GdlExpression_*,_std::allocator<GdlExpression_*>_>::size
                          ((vector<GdlExpression_*,_std::allocator<GdlExpression_*>_> *)
                           &in_RDI[1].m_lnf.field_0x20), uVar7 < sVar4; local_80 = local_80 + 1) {
      ppGVar5 = std::vector<GdlExpression_*,_std::allocator<GdlExpression_*>_>::operator[]
                          ((vector<GdlExpression_*,_std::allocator<GdlExpression_*>_> *)
                           &in_RDI[1].m_lnf.field_0x20,local_80);
      GdlObject::LineAndFile(&(*ppGVar5)->super_GdlObject);
      GrpLineAndFile::GrpLineAndFile(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      std::operator<<(local_18,"          <ruleConstraint gdl=\"{ ");
      ppGVar5 = std::vector<GdlExpression_*,_std::allocator<GdlExpression_*>_>::operator[]
                          ((vector<GdlExpression_*,_std::allocator<GdlExpression_*>_> *)
                           &in_RDI[1].m_lnf.field_0x20,local_80);
      (*(*ppGVar5)->_vptr_GdlExpression[0x1d])(*ppGVar5,local_10,local_18,1,0);
      poVar3 = std::operator<<(local_18," }\" inFile=\"");
      std::__cxx11::string::string(local_e8,in_RCX);
      GrpLineAndFile::FileWithPath(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      poVar3 = std::operator<<(poVar3,local_c8);
      poVar3 = std::operator<<(poVar3,"\" atLine=\"");
      iVar2 = GrpLineAndFile::OriginalLine(&local_a8);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      std::operator<<(poVar3,"\" />\n");
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::~string(local_e8);
      GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x124e49);
    }
    std::operator<<(local_18,"        </ruleConstraints>\n");
  }
  local_e9 = 0;
  local_ea = in_RDI[1].m_lnf.m_nLinePre != -1;
  local_f0 = 0;
  while (iVar2 = local_f0,
        sVar4 = std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::size
                          ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)
                           &in_RDI[1].m_lnf.m_staFile), iVar2 < (int)sVar4) {
    ppGVar6 = std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::operator[]
                        ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)
                         &in_RDI[1].m_lnf.m_staFile,(long)local_f0);
    local_f8 = *ppGVar6;
    if (local_f8 == (value_type)0x0) {
      local_100 = 0;
    }
    else {
      local_100 = __dynamic_cast(local_f8,&GdlRuleItem::typeinfo,&GdlSubstitutionItem::typeinfo,0);
    }
    if (local_100 != 0) {
      local_e9 = 1;
    }
    if (local_f8 == (value_type)0x0) {
      local_108 = 0;
    }
    else {
      local_108 = __dynamic_cast(local_f8,&GdlRuleItem::typeinfo,&GdlSetAttrItem::typeinfo,0);
    }
    if (local_108 == 0) {
      local_ea = 1;
    }
    else if (local_f8->m_pexpConstraint != (GdlExpression *)0x0) {
      local_ea = 1;
    }
    local_f0 = local_f0 + 1;
  }
  if ((local_e9 & 1) != 0) {
    std::operator<<(local_18,"        <lhs>\n");
    for (local_110 = 0; uVar7 = local_110,
        sVar4 = std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::size
                          ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)
                           &in_RDI[1].m_lnf.m_staFile), uVar7 < sVar4; local_110 = local_110 + 1) {
      ppGVar6 = std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::operator[]
                          ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)
                           &in_RDI[1].m_lnf.m_staFile,local_110);
      uVar1 = local_10;
      poVar3 = local_18;
      pGVar8 = *ppGVar6;
      std::__cxx11::string::string(local_130,in_RCX);
      (*pGVar8->_vptr_GdlRuleItem[0x22])(pGVar8,uVar1,poVar3,local_130);
      std::__cxx11::string::~string(local_130);
    }
    std::operator<<(local_18,"        </lhs>\n");
  }
  std::operator<<(local_18,"        <rhs>\n");
  for (local_138 = 0; uVar7 = local_138,
      sVar4 = std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::size
                        ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)
                         &in_RDI[1].m_lnf.m_staFile), uVar7 < sVar4; local_138 = local_138 + 1) {
    ppGVar6 = std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::operator[]
                        ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)
                         &in_RDI[1].m_lnf.m_staFile,local_138);
    uVar1 = local_10;
    poVar3 = local_18;
    pGVar8 = *ppGVar6;
    std::__cxx11::string::string(local_158,in_RCX);
    (*pGVar8->_vptr_GdlRuleItem[0x23])(pGVar8,uVar1,poVar3,local_158);
    std::__cxx11::string::~string(local_158);
  }
  std::operator<<(local_18,"        </rhs>\n");
  if ((local_ea & 1) != 0) {
    std::operator<<(local_18,"        <context>\n");
    local_15c = 0;
    local_168 = 0;
    while (uVar7 = local_168,
          sVar4 = std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::size
                            ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)
                             &in_RDI[1].m_lnf.m_staFile), uVar7 < sVar4) {
      if (in_RDI[1].m_lnf.m_nLinePre == (int)local_168) {
        std::operator<<(local_18,"          <caret />\n");
      }
      ppGVar6 = std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::operator[]
                          ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)
                           &in_RDI[1].m_lnf.m_staFile,local_168);
      uVar1 = local_10;
      poVar3 = local_18;
      pGVar8 = *ppGVar6;
      std::__cxx11::string::string(local_188,in_RCX);
      (*pGVar8->_vptr_GdlRuleItem[0x24])(pGVar8,uVar1,poVar3,local_188,&local_15c);
      std::__cxx11::string::~string(local_188);
      local_168 = local_168 + 1;
    }
    std::operator<<(local_18,"        </context>\n");
  }
  std::operator<<(local_18,"      </rule>\n");
  return;
}

Assistant:

void GdlRule::DebugXml(GrcManager * pcman, std::ofstream & strmOut, std::string staPathToCur,
	int nPassNum, int nRuleNum)
{
	strmOut << "      <rule id=\"" << nPassNum << "." << nRuleNum
		<< "\" inFile=\"" << LineAndFile().FileWithPath(staPathToCur)
		<< "\" atLine=\"" << LineAndFile().OriginalLine()
		<< "\" preAnys=\"" << m_critPrependedAnys
		<< "\"\n            prettyPrint=\"";
	this->RulePrettyPrint(pcman, strmOut, true);
	strmOut << "\" >\n";

	if (m_vpexpConstraints.size() > 0)
	{
		strmOut << "        <ruleConstraints>\n";
		for (size_t iexp = 0; iexp < m_vpexpConstraints.size(); iexp++)
		{
			GrpLineAndFile lnf = m_vpexpConstraints[iexp]->LineAndFile();
			strmOut << "          <ruleConstraint gdl=\"{ ";
			m_vpexpConstraints[iexp]->PrettyPrint(pcman, strmOut, true);
			strmOut << " }\" inFile=\"" << lnf.FileWithPath(staPathToCur)
				<< "\" atLine=\"" << lnf.OriginalLine() << "\" />\n";
		}
		strmOut << "        </ruleConstraints>\n";
	}

	//	Loop through all the items to see if we need a LHS or a context.
	bool fLhs = false;
	bool fContext = (m_nScanAdvance != -1);
	int irit;
	for (irit = 0; irit < signed(m_vprit.size()) ; irit++)
	{
		GdlRuleItem * prit = m_vprit[irit];
		GdlSubstitutionItem * pritsub = dynamic_cast<GdlSubstitutionItem *>(prit);
		if (pritsub)
			fLhs = true;

		GdlSetAttrItem * pritset = dynamic_cast<GdlSetAttrItem *>(prit);
		if (!pritset)
			fContext = true;
		else if (prit->m_pexpConstraint)
			fContext = true;
	}

	// LHS
	if (fLhs)
	{
		strmOut << "        <lhs>\n";
		for (size_t irit = 0; irit < m_vprit.size(); irit++)
		{
			m_vprit[irit]->DebugXmlLhs(pcman, strmOut, staPathToCur);
		}
		strmOut << "        </lhs>\n";
	}

	// RHS
	strmOut << "        <rhs>\n";
	for (size_t irit = 0; irit < m_vprit.size(); irit++)
	{
		m_vprit[irit]->DebugXmlRhs(pcman, strmOut, staPathToCur);
	}
	strmOut << "        </rhs>\n";

	// Context
	if (fContext)
	{
		strmOut << "        <context>\n";
		int iritRhs = 0;
		for (size_t irit = 0; irit < m_vprit.size(); irit++)
		{
			if (m_nScanAdvance == (signed)irit)
				strmOut << "          <caret />\n";

			m_vprit[irit]->DebugXmlContext(pcman, strmOut, staPathToCur, iritRhs);
		}
		strmOut << "        </context>\n";
	}

	strmOut << "      </rule>\n";
}